

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_prefix_coding.cpp
# Opt level: O3

bool lzham::prefix_coding::generate_codes(uint num_syms,uint8 *pCodesizes,uint16 *pCodes)

{
  uint uVar1;
  ulong uVar2;
  uint i;
  uint uVar3;
  long lVar4;
  int local_98 [6];
  uint num_codes [17];
  
  num_codes[6] = 0;
  num_codes[7] = 0;
  num_codes[8] = 0;
  num_codes[9] = 0;
  num_codes[2] = 0;
  num_codes[3] = 0;
  num_codes[4] = 0;
  num_codes[5] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  num_codes[0] = 0;
  num_codes[1] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  num_codes[10] = 0;
  if (num_syms != 0) {
    uVar2 = 0;
    do {
      local_98[pCodesizes[uVar2]] = local_98[pCodesizes[uVar2]] + 1;
      uVar2 = uVar2 + 1;
    } while (num_syms != uVar2);
  }
  num_codes[0xe] = 0;
  uVar1 = 0;
  lVar4 = 1;
  do {
    num_codes[lVar4 + 0xe] = uVar1;
    uVar1 = (uVar1 + local_98[lVar4]) * 2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x11);
  if (uVar1 != 0x20000) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 + local_98[lVar4 + 1];
      if (1 < uVar3) {
        return false;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
  }
  if (num_syms != 0) {
    uVar2 = 0;
    do {
      uVar1 = num_codes[(ulong)pCodesizes[uVar2] + 0xe];
      num_codes[(ulong)pCodesizes[uVar2] + 0xe] = uVar1 + 1;
      pCodes[uVar2] = (uint16)uVar1;
      uVar2 = uVar2 + 1;
    } while (num_syms != uVar2);
  }
  return true;
}

Assistant:

bool generate_codes(uint num_syms, const uint8* pCodesizes, uint16* pCodes)
      {
         uint num_codes[cMaxExpectedHuffCodeSize + 1];
         utils::zero_object(num_codes);

         for (uint i = 0; i < num_syms; i++)
         {
            uint c = pCodesizes[i];
            LZHAM_ASSERT(c <= cMaxExpectedHuffCodeSize);
            num_codes[c]++;
         }

         uint code = 0;

         uint next_code[cMaxExpectedHuffCodeSize + 1];
         next_code[0] = 0;
         
         for (uint i = 1; i <= cMaxExpectedHuffCodeSize; i++)
         {
            next_code[i] = code;
            
            code = (code + num_codes[i]) << 1;
         }

         if (code != (1 << (cMaxExpectedHuffCodeSize + 1)))
         {
            uint t = 0;
            for (uint i = 1; i <= cMaxExpectedHuffCodeSize; i++)
            {
               t += num_codes[i];
               if (t > 1)
               {
                  LZHAM_LOG_ERROR(3003);
                  return false;
               }
            }
         }

         for (uint i = 0; i < num_syms; i++)
         {
            uint c = pCodesizes[i];
            
            LZHAM_ASSERT(!c || (next_code[c] <= cUINT16_MAX));
            
            pCodes[i] = static_cast<uint16>(next_code[c]++);
            
            LZHAM_ASSERT(!c || (math::total_bits(pCodes[i]) <= pCodesizes[i]));
         }
         
         return true;
      }